

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rangeproof_impl.h
# Opt level: O3

int secp256k1_rangeproof_rewind_inner
              (secp256k1_scalar *blind,uint64_t *v,uchar *m,size_t *mlen,secp256k1_scalar *ev,
              secp256k1_scalar *s,size_t *rsizes,size_t rings,uchar *nonce,secp256k1_ge *commit,
              uchar *proof,size_t len,secp256k1_ge *genp)

{
  ulong uVar1;
  uint *puVar2;
  size_t sVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  int iVar10;
  secp256k1_scalar *psVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  uint *puVar16;
  ulong uVar17;
  size_t sVar18;
  ulong uVar19;
  long lVar20;
  uchar *puVar21;
  bool bVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  uchar tmp [32];
  secp256k1_scalar stmp;
  secp256k1_scalar stmp_1;
  secp256k1_scalar sec [32];
  uchar prep [4096];
  secp256k1_scalar s_orig [128];
  undefined8 local_24c8;
  undefined8 uStack_24c0;
  uint64_t local_24b8;
  uint64_t auStack_24b0 [2];
  uchar *local_24a0;
  ulong local_2498;
  secp256k1_scalar *local_2490;
  ulong local_2488;
  long local_2480;
  secp256k1_scalar local_2478;
  secp256k1_scalar local_2458;
  secp256k1_scalar local_2438 [32];
  uint local_2038 [2];
  undefined8 uStack_2030;
  uint64_t auStack_2028 [510];
  secp256k1_scalar local_1038 [128];
  
  local_24a0 = m;
  memset(local_2038,0,0x1000);
  secp256k1_rangeproof_genrand
            (local_2438,local_1038,(uchar *)local_2038,rsizes,rings,nonce,commit,proof,len,genp);
  *v = 0xffffffffffffffff;
  blind->d[0] = 0;
  blind->d[1] = 0;
  blind->d[2] = 0;
  blind->d[3] = 0;
  if ((rings == 1) && (*rsizes == 1)) {
    secp256k1_scalar_negate(blind,s);
    secp256k1_scalar_add(blind,blind,local_1038);
    secp256k1_scalar_inverse(&local_2458,ev);
    secp256k1_scalar_mul(blind,blind,&local_2458);
    *v = 0;
LAB_0013eb13:
    iVar10 = 1;
LAB_0013ebc9:
    if (mlen != (size_t *)0x0) {
LAB_0013ebce:
      uVar26 = 0;
LAB_0013ebd1:
      *mlen = uVar26;
    }
    return iVar10;
  }
  local_2480 = rings - 1;
  uVar1 = rings * 4 - 4;
  sVar3 = rsizes[rings - 1];
  lVar14 = -1;
  bVar22 = true;
LAB_0013eb52:
  lVar20 = uVar1 + lVar14 + sVar3;
  secp256k1_scalar_get_b32((uchar *)&local_24c8,s + lVar20);
  lVar12 = local_2480;
  lVar15 = 0;
  do {
    uVar4 = *(uint *)((long)&uStack_24c0 + lVar15);
    uVar5 = *(uint *)((long)&uStack_24c0 + lVar15 + 4);
    puVar16 = (uint *)((long)(local_2038 + lVar20 * 8) + lVar15);
    uVar6 = puVar16[1];
    uVar7 = puVar16[2];
    uVar8 = puVar16[3];
    *(uint *)((long)&local_24c8 + lVar15) = *(uint *)((long)&local_24c8 + lVar15) ^ *puVar16;
    *(uint *)((long)&local_24c8 + lVar15 + 4) = *(uint *)((long)&local_24c8 + lVar15 + 4) ^ uVar6;
    *(uint *)((long)&uStack_24c0 + lVar15) = uVar4 ^ uVar7;
    *(uint *)((long)&uStack_24c0 + lVar15 + 4) = uVar5 ^ uVar8;
    puVar21 = local_24a0;
    lVar15 = lVar15 + 0x10;
  } while (lVar15 != 0x20);
  if (((-1 < (char)(uchar)local_24c8) || (local_24b8 != auStack_24b0[0])) ||
     (uStack_24c0 != local_24b8)) goto LAB_0013ebb4;
  lVar15 = 0x18;
  local_2488 = 0;
  do {
    local_2488 = (ulong)*(byte *)((long)&local_24c8 + lVar15) | local_2488 << 8;
    lVar15 = lVar15 + 1;
  } while (lVar15 != 0x20);
  *v = local_2488;
  auStack_2028[lVar20 * 4] = local_24b8;
  local_1038[lVar20 + -0x80].d[3] = auStack_24b0[0];
  *(ulong *)(local_2038 + lVar20 * 8) = CONCAT71(local_24c8._1_7_,(uchar)local_24c8);
  (&uStack_2030)[lVar20 * 4] = uStack_24c0;
  sVar3 = rsizes[rings - 1];
  local_2498 = (ulong)((uint)(local_2488 >> ((char)local_2480 * '\x02' & 0x3fU)) & 3);
  if (lVar14 + sVar3 == local_2498) {
    iVar10 = 0;
    goto LAB_0013ebc9;
  }
  local_2498 = local_2498 | uVar1;
  local_2490 = local_1038 + local_2498;
  psVar11 = ev + local_2498;
  secp256k1_scalar_negate(&local_2478,s + local_2498);
  secp256k1_scalar_add(&local_2478,&local_2478,local_2490);
  secp256k1_scalar_inverse(&local_2458,psVar11);
  secp256k1_scalar_mul(&local_2478,&local_2478,&local_2458);
  psVar11 = local_2438 + lVar12;
  secp256k1_scalar_negate(psVar11,psVar11);
  secp256k1_scalar_add(blind,&local_2478,psVar11);
  if (mlen == (size_t *)0x0 || puVar21 == (uchar *)0x0) goto LAB_0013eb13;
  iVar10 = 1;
  if (rings == 0 || *mlen == 0) goto LAB_0013ebce;
  uVar23 = 0;
  sVar18 = 0;
  uVar26 = 0;
  uVar17 = local_2498;
  do {
    uVar19 = local_2488 >> ((char)sVar18 * '\x02' & 0x3fU);
    uVar13 = rsizes[sVar18];
    if (uVar13 != 0) {
      puVar16 = local_2038 + uVar23 * 8;
      uVar24 = 0;
      uVar25 = uVar26;
      do {
        uVar26 = uVar25;
        if ((uVar23 != lVar14 + sVar3 + uVar1) && (uVar23 != uVar17)) {
          if (((uint)uVar19 & 3) == uVar24) {
            secp256k1_scalar_mul(&local_2458,local_2438 + sVar18,ev + uVar23);
            puVar21 = local_24a0;
            secp256k1_scalar_add(&local_2478,s + uVar23,&local_2458);
          }
          else {
            local_2478.d[0] = s[uVar23].d[0];
            local_2478.d[1] = s[uVar23].d[1];
            local_2478.d[2] = s[uVar23].d[2];
            local_2478.d[3] = (s[uVar23].d + 2)[1];
          }
          secp256k1_scalar_get_b32((uchar *)&local_24c8,&local_2478);
          lVar12 = 0;
          do {
            uVar4 = *(uint *)((long)&uStack_24c0 + lVar12);
            uVar5 = *(uint *)((long)&uStack_24c0 + lVar12 + 4);
            puVar2 = (uint *)((long)puVar16 + lVar12);
            uVar6 = puVar2[1];
            uVar7 = puVar2[2];
            uVar8 = puVar2[3];
            *(uint *)((long)&local_24c8 + lVar12) = *(uint *)((long)&local_24c8 + lVar12) ^ *puVar2;
            *(uint *)((long)&local_24c8 + lVar12 + 4) =
                 *(uint *)((long)&local_24c8 + lVar12 + 4) ^ uVar6;
            *(uint *)((long)&uStack_24c0 + lVar12) = uVar4 ^ uVar7;
            *(uint *)((long)&uStack_24c0 + lVar12 + 4) = uVar5 ^ uVar8;
            lVar12 = lVar12 + 0x10;
          } while (lVar12 != 0x20);
          lVar12 = 0;
          do {
            uVar26 = uVar25 + lVar12;
            if (*mlen <= uVar26) goto LAB_0013eeb5;
            puVar21[lVar12 + uVar25] = *(uchar *)((long)&local_24c8 + lVar12);
            lVar12 = lVar12 + 1;
          } while (lVar12 != 0x20);
          uVar26 = uVar25 + 0x20;
LAB_0013eeb5:
          uVar13 = rsizes[sVar18];
          uVar17 = local_2498;
        }
        uVar23 = uVar23 + 1;
        uVar24 = uVar24 + 1;
        puVar16 = puVar16 + 8;
        uVar25 = uVar26;
      } while (uVar24 < uVar13);
    }
    sVar18 = sVar18 + 1;
  } while (sVar18 != rings);
  iVar10 = 1;
  goto LAB_0013ebd1;
LAB_0013ebb4:
  lVar14 = -2;
  iVar10 = 0;
  bVar9 = !bVar22;
  bVar22 = false;
  if (bVar9) goto LAB_0013ebc9;
  goto LAB_0013eb52;
}

Assistant:

SECP256K1_INLINE static int secp256k1_rangeproof_rewind_inner(secp256k1_scalar *blind, uint64_t *v,
 unsigned char *m, size_t *mlen, secp256k1_scalar *ev, secp256k1_scalar *s,
 size_t *rsizes, size_t rings, const unsigned char *nonce, const secp256k1_ge *commit, const unsigned char *proof, size_t len, const secp256k1_ge *genp) {
    secp256k1_scalar s_orig[128];
    secp256k1_scalar sec[32];
    secp256k1_scalar stmp;
    unsigned char prep[4096];
    unsigned char tmp[32];
    uint64_t value = 0;
    size_t offset;
    size_t i;
    size_t j;
    int b;
    size_t skip1;
    size_t skip2;
    size_t npub;
    npub = ((rings - 1) << 2) + rsizes[rings-1];
    VERIFY_CHECK(npub <= 128);
    VERIFY_CHECK(npub >= 1);
    memset(prep, 0, 4096);
    /* Reconstruct the provers random values. */
    secp256k1_rangeproof_genrand(sec, s_orig, prep, rsizes, rings, nonce, commit, proof, len, genp);
    *v = UINT64_MAX;
    secp256k1_scalar_clear(blind);
    if (rings == 1 && rsizes[0] == 1) {
        /* With only a single proof, we can only recover the blinding factor. */
        secp256k1_rangeproof_recover_x(blind, &s_orig[0], &ev[0], &s[0]);
        if (v) {
            *v = 0;
        }
        if (mlen) {
            *mlen = 0;
        }
        return 1;
    }
    npub = (rings - 1) << 2;
    for (j = 0; j < 2; j++) {
        size_t idx;
        /* Look for a value encoding in the last ring. */
        idx = npub + rsizes[rings - 1] - 1 - j;
        secp256k1_scalar_get_b32(tmp, &s[idx]);
        secp256k1_rangeproof_ch32xor(tmp, &prep[idx * 32]);
        if ((tmp[0] & 128) && (memcmp(&tmp[16], &tmp[24], 8) == 0) && (memcmp(&tmp[8], &tmp[16], 8) == 0)) {
            value = 0;
            for (i = 0; i < 8; i++) {
                value = (value << 8) + tmp[24 + i];
            }
            if (v) {
                *v = value;
            }
            memcpy(&prep[idx * 32], tmp, 32);
            break;
        }
    }
    if (j > 1) {
        /* Couldn't extract a value. */
        if (mlen) {
            *mlen = 0;
        }
        return 0;
    }
    skip1 = rsizes[rings - 1] - 1 - j;
    skip2 = ((value >> ((rings - 1) << 1)) & 3);
    if (skip1 == skip2) {
        /*Value is in wrong position.*/
        if (mlen) {
            *mlen = 0;
        }
        return 0;
    }
    skip1 += (rings - 1) << 2;
    skip2 += (rings - 1) << 2;
    /* Like in the rsize[] == 1 case, Having figured out which s is the one which was not forged, we can recover the blinding factor. */
    secp256k1_rangeproof_recover_x(&stmp, &s_orig[skip2], &ev[skip2], &s[skip2]);
    secp256k1_scalar_negate(&sec[rings - 1], &sec[rings - 1]);
    secp256k1_scalar_add(blind, &stmp, &sec[rings - 1]);
    if (!m || !mlen || *mlen == 0) {
        if (mlen) {
            *mlen = 0;
        }
        /* FIXME: cleanup in early out/failure cases. */
        return 1;
    }
    offset = 0;
    npub = 0;
    for (i = 0; i < rings; i++) {
        size_t idx;
        idx = (value >> (i << 1)) & 3;
        for (j = 0; j < rsizes[i]; j++) {
            if (npub == skip1 || npub == skip2) {
                npub++;
                continue;
            }
            if (idx == j) {
                /** For the non-forged signatures the signature is calculated instead of random, instead we recover the prover's nonces.
                 *  this could just as well recover the blinding factors and messages could be put there as is done for recovering the
                 *  blinding factor in the last ring, but it takes an inversion to recover x so it's faster to put the message data in k.
                 */
                secp256k1_rangeproof_recover_k(&stmp, &sec[i], &ev[npub], &s[npub]);
            } else {
                stmp = s[npub];
            }
            secp256k1_scalar_get_b32(tmp, &stmp);
            secp256k1_rangeproof_ch32xor(tmp, &prep[npub * 32]);
            for (b = 0; b < 32 && offset < *mlen; b++) {
                m[offset] = tmp[b];
                offset++;
            }
            npub++;
        }
    }
    *mlen = offset;
    memset(prep, 0, 4096);
    for (i = 0; i < 128; i++) {
        secp256k1_scalar_clear(&s_orig[i]);
    }
    for (i = 0; i < 32; i++) {
        secp256k1_scalar_clear(&sec[i]);
    }
    secp256k1_scalar_clear(&stmp);
    return 1;
}